

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib643.c
# Opt level: O3

int once(char *URL,_Bool oldstyle)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  undefined8 uVar5;
  char *pcVar6;
  WriteThis pooh;
  WriteThis pooh2;
  char *local_50;
  undefined8 local_48;
  char *local_40;
  undefined8 local_38;
  
  local_50 = data;
  local_48 = 0xffffffffffffffff;
  lVar2 = curl_easy_init();
  if (lVar2 == 0) {
    curl_mfprintf(_stderr,"curl_easy_init() failed\n");
    goto LAB_00101734;
  }
  lVar3 = curl_mime_init(lVar2);
  if (lVar3 == 0) {
    curl_mfprintf(_stderr,"curl_mime_init() failed\n");
  }
  else {
    lVar4 = curl_mime_addpart(lVar3);
    if (lVar4 == 0) {
      pcVar6 = "curl_mime_addpart(1) failed\n";
    }
    else {
      if (oldstyle) {
        iVar1 = curl_mime_name(lVar4,"sendfile");
        if ((iVar1 != 0) ||
           (iVar1 = curl_mime_data_cb(lVar4,0xffffffffffffffff,read_callback,0,0,&local_50),
           iVar1 != 0)) goto LAB_001014b6;
        pcVar6 = "postit2.c";
LAB_001014aa:
        iVar1 = curl_mime_filename(lVar4,pcVar6);
        if (iVar1 != 0) goto LAB_001014b6;
      }
      else {
        iVar1 = curl_mime_name(lVar4,"sendfile alternative");
        if ((iVar1 == 0) &&
           (iVar1 = curl_mime_data_cb(lVar4,0xffffffffffffffff,read_callback,0,0,&local_50),
           iVar1 == 0)) {
          pcVar6 = "file name 2";
          goto LAB_001014aa;
        }
LAB_001014b6:
        uVar5 = curl_easy_strerror(iVar1);
        curl_mprintf("curl_mime_xxx(1) = %s\n",uVar5);
      }
      local_40 = data;
      local_38 = 0xffffffffffffffff;
      lVar4 = curl_mime_addpart(lVar3);
      if (lVar4 == 0) {
        pcVar6 = "curl_mime_addpart(2) failed\n";
      }
      else {
        iVar1 = curl_mime_name(lVar4,"callbackdata");
        if ((iVar1 != 0) ||
           (iVar1 = curl_mime_data_cb(lVar4,0xffffffffffffffff,read_callback,0,0,&local_40),
           iVar1 != 0)) {
          uVar5 = curl_easy_strerror(iVar1);
          curl_mprintf("curl_mime_xxx(2) = %s\n",uVar5);
        }
        lVar4 = curl_mime_addpart(lVar3);
        if (lVar4 == 0) {
          pcVar6 = "curl_mime_addpart(3) failed\n";
        }
        else {
          iVar1 = curl_mime_name(lVar4,"filename");
          if ((iVar1 != 0) ||
             (iVar1 = curl_mime_data(lVar4,"postit2.c",0xffffffffffffffff), iVar1 != 0)) {
            uVar5 = curl_easy_strerror(iVar1);
            curl_mprintf("curl_mime_xxx(3) = %s\n",uVar5);
          }
          lVar4 = curl_mime_addpart(lVar3);
          if (lVar4 == 0) {
            pcVar6 = "curl_mime_addpart(4) failed\n";
          }
          else {
            iVar1 = curl_mime_name(lVar4,"submit");
            if ((iVar1 != 0) ||
               (iVar1 = curl_mime_data(lVar4,"send",0xffffffffffffffff), iVar1 != 0)) {
              uVar5 = curl_easy_strerror(iVar1);
              curl_mprintf("curl_mime_xxx(4) = %s\n",uVar5);
            }
            lVar4 = curl_mime_addpart(lVar3);
            if (lVar4 != 0) {
              iVar1 = curl_mime_name(lVar4,"somename");
              if (((iVar1 != 0) || (iVar1 = curl_mime_filename(lVar4,"somefile.txt"), iVar1 != 0))
                 || (iVar1 = curl_mime_data(lVar4,"blah blah",9), iVar1 != 0)) {
                uVar5 = curl_easy_strerror(iVar1);
                curl_mprintf("curl_mime_xxx(5) = %s\n",uVar5);
              }
              iVar1 = curl_easy_setopt(lVar2,0x2712,URL);
              if (((iVar1 == 0) && (iVar1 = curl_easy_setopt(lVar2,0x281d,lVar3), iVar1 == 0)) &&
                 ((iVar1 = curl_easy_setopt(lVar2,0x29,1), iVar1 == 0 &&
                  (iVar1 = curl_easy_setopt(lVar2,0x2a,1), iVar1 == 0)))) {
                iVar1 = curl_easy_perform(lVar2);
              }
              curl_easy_cleanup(lVar2);
              curl_mime_free(lVar3);
              return iVar1;
            }
            pcVar6 = "curl_mime_addpart(5) failed\n";
          }
        }
      }
    }
    curl_mfprintf(_stderr,pcVar6);
    curl_mime_free(lVar3);
  }
  curl_easy_cleanup(lVar2);
LAB_00101734:
  curl_global_cleanup();
  return 0x7e;
}

Assistant:

static int once(char *URL, bool oldstyle)
{
  CURL *curl;
  CURLcode res = CURLE_OK;

  curl_mime *mime = NULL;
  curl_mimepart *part = NULL;
  struct WriteThis pooh;
  struct WriteThis pooh2;
  curl_off_t datasize = -1;

  pooh.readptr = data;
#ifndef LIB645
  datasize = (curl_off_t)strlen(data);
#endif
  pooh.sizeleft = datasize;

  curl = curl_easy_init();
  if(!curl) {
    fprintf(stderr, "curl_easy_init() failed\n");
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }

  mime = curl_mime_init(curl);
  if(!mime) {
    fprintf(stderr, "curl_mime_init() failed\n");
    curl_easy_cleanup(curl);
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }

  part = curl_mime_addpart(mime);
  if(!part) {
    fprintf(stderr, "curl_mime_addpart(1) failed\n");
    curl_mime_free(mime);
    curl_easy_cleanup(curl);
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }

  /* Fill in the file upload part */
  if(oldstyle) {
    res = curl_mime_name(part, "sendfile");
    if(!res)
      res = curl_mime_data_cb(part, datasize, read_callback,
                              NULL, NULL, &pooh);
    if(!res)
      res = curl_mime_filename(part, "postit2.c");
  }
  else {
    /* new style */
    res = curl_mime_name(part, "sendfile alternative");
    if(!res)
      res = curl_mime_data_cb(part, datasize, read_callback,
                              NULL, NULL, &pooh);
    if(!res)
      res = curl_mime_filename(part, "file name 2");
  }

  if(res)
    printf("curl_mime_xxx(1) = %s\n", curl_easy_strerror(res));

  /* Now add the same data with another name and make it not look like
     a file upload but still using the callback */

  pooh2.readptr = data;
#ifndef LIB645
  datasize = (curl_off_t)strlen(data);
#endif
  pooh2.sizeleft = datasize;

  part = curl_mime_addpart(mime);
  if(!part) {
    fprintf(stderr, "curl_mime_addpart(2) failed\n");
    curl_mime_free(mime);
    curl_easy_cleanup(curl);
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }
  /* Fill in the file upload part */
  res = curl_mime_name(part, "callbackdata");
  if(!res)
    res = curl_mime_data_cb(part, datasize, read_callback,
                            NULL, NULL, &pooh2);

  if(res)
    printf("curl_mime_xxx(2) = %s\n", curl_easy_strerror(res));

  part = curl_mime_addpart(mime);
  if(!part) {
    fprintf(stderr, "curl_mime_addpart(3) failed\n");
    curl_mime_free(mime);
    curl_easy_cleanup(curl);
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }

  /* Fill in the filename field */
  res = curl_mime_name(part, "filename");
  if(!res)
    res = curl_mime_data(part,
#ifdef CURL_DOES_CONVERSIONS
                         /* ASCII representation with escape
                            sequences for non-ASCII platforms */
                         "\x70\x6f\x73\x74\x69\x74\x32\x2e\x63",
#else
                          "postit2.c",
#endif
                          CURL_ZERO_TERMINATED);

  if(res)
    printf("curl_mime_xxx(3) = %s\n", curl_easy_strerror(res));

  /* Fill in a submit field too */
  part = curl_mime_addpart(mime);
  if(!part) {
    fprintf(stderr, "curl_mime_addpart(4) failed\n");
    curl_mime_free(mime);
    curl_easy_cleanup(curl);
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }
  res = curl_mime_name(part, "submit");
  if(!res)
    res = curl_mime_data(part,
#ifdef CURL_DOES_CONVERSIONS
                         /* ASCII representation with escape
                            sequences for non-ASCII platforms */
                         "\x73\x65\x6e\x64",
#else
                          "send",
#endif
                          CURL_ZERO_TERMINATED);

  if(res)
    printf("curl_mime_xxx(4) = %s\n", curl_easy_strerror(res));

  part = curl_mime_addpart(mime);
  if(!part) {
    fprintf(stderr, "curl_mime_addpart(5) failed\n");
    curl_mime_free(mime);
    curl_easy_cleanup(curl);
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }
  res = curl_mime_name(part, "somename");
  if(!res)
    res = curl_mime_filename(part, "somefile.txt");
  if(!res)
    res = curl_mime_data(part, "blah blah", 9);

  if(res)
    printf("curl_mime_xxx(5) = %s\n", curl_easy_strerror(res));

  /* First set the URL that is about to receive our POST. */
  test_setopt(curl, CURLOPT_URL, URL);

  /* send a multi-part mimepost */
  test_setopt(curl, CURLOPT_MIMEPOST, mime);

  /* get verbose debug output please */
  test_setopt(curl, CURLOPT_VERBOSE, 1L);

  /* include headers in the output */
  test_setopt(curl, CURLOPT_HEADER, 1L);

  /* Perform the request, res will get the return code */
  res = curl_easy_perform(curl);

test_cleanup:

  /* always cleanup */
  curl_easy_cleanup(curl);

  /* now cleanup the mimepost structure */
  curl_mime_free(mime);

  return res;
}